

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O1

line_data_t * kiste::parse_line(line_data_t *__return_storage_ptr__,parse_context *ctx)

{
  string *line;
  undefined8 *puVar1;
  undefined8 **ppuVar2;
  char cVar3;
  pointer psVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  pointer psVar8;
  bool bVar9;
  initializer_list<kiste::segment_t> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rest;
  allocator_type local_e9;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  string local_a8;
  undefined8 **local_88;
  long local_80;
  undefined8 *local_78 [2];
  undefined8 **local_68;
  long local_60;
  undefined8 *local_58 [2];
  vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> local_48;
  
  line = &ctx->_line;
  uVar5 = std::__cxx11::string::find_first_not_of((char *)line,0x1090d6,0);
  if (uVar5 == 0xffffffffffffffff) {
    if ((ctx->_class_curly_level != 0) && (ctx->_class_curly_level < ctx->_curly_level)) {
      parse_text_line(__return_storage_ptr__,ctx,line);
      return __return_storage_ptr__;
    }
    memset(__return_storage_ptr__,0,0xa0);
    (__return_storage_ptr__->_class_data)._name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_class_data)._name.field_2;
    (__return_storage_ptr__->_class_data)._name._M_string_length = 0;
    (__return_storage_ptr__->_class_data)._name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_class_data)._parent_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_class_data)._parent_name.field_2;
    (__return_storage_ptr__->_class_data)._parent_name._M_string_length = 0;
    (__return_storage_ptr__->_class_data)._parent_name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_member).class_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_member).class_name.field_2;
    (__return_storage_ptr__->_member).class_name._M_string_length = 0;
    (__return_storage_ptr__->_member).class_name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_member).name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_member).name.field_2;
    (__return_storage_ptr__->_member).name._M_string_length = 0;
    (__return_storage_ptr__->_member).name.field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)&local_a8,(ulong)line);
  if ((ctx->_line)._M_string_length <= uVar5) {
    uVar7 = std::__throw_out_of_range_fmt
                      ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar5);
    if ((undefined8 **)local_e8._0_8_ != (undefined8 **)(uVar5 + 1)) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar7);
  }
  cVar3 = (line->_M_dataplus)._M_p[uVar5];
  if (cVar3 == '$') {
    ppuVar2 = (undefined8 **)(local_e8 + 0x10);
    local_e8._0_8_ = ppuVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"class","");
    if (local_a8._M_string_length < (ulong)local_e8._8_8_) {
LAB_001053d2:
      bVar9 = false;
    }
    else {
      bVar9 = (pointer)local_e8._8_8_ == (pointer)0x0;
      if (!bVar9) {
        if (*(char *)local_e8._0_8_ != *local_a8._M_dataplus._M_p) goto LAB_001053d2;
        psVar4 = (pointer)0x1;
        do {
          psVar8 = psVar4;
          if ((pointer)local_e8._8_8_ == psVar8) break;
          psVar4 = (pointer)((long)&psVar8->_end_pos + 1);
        } while (*(char *)(local_e8._0_8_ + (long)psVar8) == local_a8._M_dataplus._M_p[(long)psVar8]
                );
        bVar9 = (ulong)local_e8._8_8_ <= psVar8;
      }
    }
    if ((undefined8 **)local_e8._0_8_ != ppuVar2) {
      operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
    }
    if (bVar9) {
      parse_class((class_t *)local_e8,ctx,&local_a8);
      line_data_t::line_data_t(__return_storage_ptr__,(class_t *)local_e8);
LAB_0010540f:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_allocated_capacity != &local_b8) {
        operator_delete((void *)local_c8._M_allocated_capacity,local_b8._M_allocated_capacity + 1);
      }
    }
    else {
      local_e8._0_8_ = ppuVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"endclass","");
      if (local_a8._M_string_length < (ulong)local_e8._8_8_) {
LAB_001054a8:
        bVar9 = false;
      }
      else {
        bVar9 = (pointer)local_e8._8_8_ == (pointer)0x0;
        if (!bVar9) {
          if (*(char *)local_e8._0_8_ != *local_a8._M_dataplus._M_p) goto LAB_001054a8;
          psVar4 = (pointer)0x1;
          do {
            psVar8 = psVar4;
            if ((pointer)local_e8._8_8_ == psVar8) break;
            psVar4 = (pointer)((long)&psVar8->_end_pos + 1);
          } while (*(char *)(local_e8._0_8_ + (long)psVar8) ==
                   local_a8._M_dataplus._M_p[(long)psVar8]);
          bVar9 = (ulong)local_e8._8_8_ <= psVar8;
        }
      }
      if ((undefined8 **)local_e8._0_8_ != ppuVar2) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
      }
      if (bVar9) {
        local_e8._0_8_ = (undefined8 **)0x0;
        local_e8._8_8_ = (pointer)0x0;
        local_d8._M_allocated_capacity = 0;
        __return_storage_ptr__->_type = class_end;
        std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
                  (&__return_storage_ptr__->_segments,
                   (vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)local_e8);
        (__return_storage_ptr__->_class_data)._name._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_class_data)._name.field_2;
        (__return_storage_ptr__->_class_data)._name._M_string_length = 0;
        (__return_storage_ptr__->_class_data)._name.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->_class_data)._parent_name._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_class_data)._parent_name.field_2;
        (__return_storage_ptr__->_class_data)._parent_name._M_string_length = 0;
        (__return_storage_ptr__->_class_data)._parent_name.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->_member).class_name._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_member).class_name.field_2;
        (__return_storage_ptr__->_member).class_name._M_string_length = 0;
        (__return_storage_ptr__->_member).class_name.field_2._M_local_buf[0] = '\0';
        (__return_storage_ptr__->_member).name._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_member).name.field_2;
        (__return_storage_ptr__->_member).name._M_string_length = 0;
        (__return_storage_ptr__->_member).name.field_2._M_local_buf[0] = '\0';
        std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector
                  ((vector<kiste::segment_t,_std::allocator<kiste::segment_t>_> *)local_e8);
        goto LAB_001057f0;
      }
      local_e8._0_8_ = ppuVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"member","");
      if (local_a8._M_string_length < (ulong)local_e8._8_8_) {
LAB_001056ec:
        bVar9 = false;
      }
      else {
        bVar9 = (pointer)local_e8._8_8_ == (pointer)0x0;
        if (!bVar9) {
          if (*(char *)local_e8._0_8_ != *local_a8._M_dataplus._M_p) goto LAB_001056ec;
          psVar4 = (pointer)0x1;
          do {
            psVar8 = psVar4;
            if ((pointer)local_e8._8_8_ == psVar8) break;
            psVar4 = (pointer)((long)&psVar8->_end_pos + 1);
          } while (*(char *)(local_e8._0_8_ + (long)psVar8) ==
                   local_a8._M_dataplus._M_p[(long)psVar8]);
          bVar9 = (ulong)local_e8._8_8_ <= psVar8;
        }
      }
      if ((undefined8 **)local_e8._0_8_ != ppuVar2) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
      }
      if (bVar9) {
        parse_class_member((member_t *)local_e8,ctx,&local_a8);
        line_data_t::line_data_t(__return_storage_ptr__,(member_t *)local_e8);
        goto LAB_0010540f;
      }
      local_e8._0_8_ = ppuVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"|","");
      if (local_a8._M_string_length < (ulong)local_e8._8_8_) {
LAB_00105794:
        bVar9 = false;
      }
      else {
        bVar9 = (pointer)local_e8._8_8_ == (pointer)0x0;
        if (!bVar9) {
          if (*(char *)local_e8._0_8_ != *local_a8._M_dataplus._M_p) goto LAB_00105794;
          psVar4 = (pointer)0x1;
          do {
            psVar8 = psVar4;
            if ((pointer)local_e8._8_8_ == psVar8) break;
            psVar4 = (pointer)((long)&psVar8->_end_pos + 1);
          } while (*(char *)(local_e8._0_8_ + (long)psVar8) ==
                   local_a8._M_dataplus._M_p[(long)psVar8]);
          bVar9 = (ulong)local_e8._8_8_ <= psVar8;
        }
      }
      if ((undefined8 **)local_e8._0_8_ != ppuVar2) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_allocated_capacity + 1));
      }
      if (!bVar9) goto LAB_001057e2;
      std::__cxx11::string::substr((ulong)local_e8,(ulong)line);
      parse_text_line(__return_storage_ptr__,ctx,(string *)local_e8);
    }
    local_58[0] = (undefined8 *)local_d8._M_allocated_capacity;
    local_68 = (undefined8 **)local_e8._0_8_;
    if ((undefined8 **)local_e8._0_8_ == ppuVar2) goto LAB_001057f0;
  }
  else {
    if (cVar3 != '%') {
LAB_001057e2:
      parse_text_line(__return_storage_ptr__,ctx,line);
      goto LAB_001057f0;
    }
    local_e8._0_8_ = (undefined8 **)0x0;
    local_e8._8_8_ = local_e8._8_8_ & 0xffffffff00000000;
    std::__cxx11::string::substr((ulong)&local_68,(ulong)line);
    std::__cxx11::string::substr((ulong)&local_88,(ulong)line);
    puVar6 = (undefined8 *)0xf;
    if (local_68 != local_58) {
      puVar6 = local_58[0];
    }
    if (puVar6 < (undefined8 *)(local_80 + local_60)) {
      puVar6 = (undefined8 *)0xf;
      if (local_88 != local_78) {
        puVar6 = local_78[0];
      }
      if (puVar6 < (undefined8 *)(local_80 + local_60)) goto LAB_001052b6;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,(ulong)local_68);
    }
    else {
LAB_001052b6:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_88);
    }
    local_d8._M_allocated_capacity = (size_type)(local_e8 + 0x20);
    puVar1 = puVar6 + 2;
    if ((undefined8 *)*puVar6 == puVar1) {
      local_c8._M_allocated_capacity = *puVar1;
      local_c8._8_8_ = puVar6[3];
    }
    else {
      local_c8._M_allocated_capacity = *puVar1;
      local_d8._M_allocated_capacity = (size_type)(undefined8 *)*puVar6;
    }
    local_d8._8_8_ = puVar6[1];
    *puVar6 = puVar1;
    puVar6[1] = 0;
    *(undefined1 *)puVar1 = 0;
    __l._M_len = 1;
    __l._M_array = (iterator)local_e8;
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
              (&local_48,__l,&local_e9);
    __return_storage_ptr__->_type = cpp;
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::vector
              (&__return_storage_ptr__->_segments,&local_48);
    (__return_storage_ptr__->_class_data)._name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_class_data)._name.field_2;
    (__return_storage_ptr__->_class_data)._name._M_string_length = 0;
    (__return_storage_ptr__->_class_data)._name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_class_data)._parent_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_class_data)._parent_name.field_2;
    (__return_storage_ptr__->_class_data)._parent_name._M_string_length = 0;
    (__return_storage_ptr__->_class_data)._parent_name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_member).class_name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_member).class_name.field_2;
    (__return_storage_ptr__->_member).class_name._M_string_length = 0;
    (__return_storage_ptr__->_member).class_name.field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->_member).name._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_member).name.field_2;
    (__return_storage_ptr__->_member).name._M_string_length = 0;
    (__return_storage_ptr__->_member).name.field_2._M_local_buf[0] = '\0';
    std::vector<kiste::segment_t,_std::allocator<kiste::segment_t>_>::~vector(&local_48);
    if ((undefined1 *)local_d8._M_allocated_capacity != local_e8 + 0x20) {
      operator_delete((void *)local_d8._M_allocated_capacity,
                      (ulong)(local_c8._M_allocated_capacity + 1));
    }
    if (local_88 != local_78) {
      operator_delete(local_88,(ulong)((long)local_78[0] + 1));
    }
    if (local_68 == local_58) goto LAB_001057f0;
  }
  operator_delete(local_68,(ulong)((long)local_58[0] + 1));
LAB_001057f0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto parse_line(const parse_context& ctx) -> line_data_t
  {
    const auto pos_first_char = ctx._line.find_first_not_of(" \t");
    if (pos_first_char == ctx._line.npos)
    {
      if (ctx._class_curly_level and ctx._curly_level > ctx._class_curly_level)
      {
        return parse_text_line(ctx, ctx._line);
      }
      else
      {
        return line_data_t{};
      }
    }
    else
    {
      const auto rest = ctx._line.substr(pos_first_char + 1);
      switch (ctx._line.at(pos_first_char))
      {
      case '%':  // cpp line
        return line_data_t{line_type::cpp,
                           std::vector<segment_t>{{0,
                                                   segment_type::cpp,
                                                   ctx._line.substr(0, pos_first_char) +
                                                       ctx._line.substr(pos_first_char + 1)}}};
        break;
      case '$':  // opening / closing class or text line
        if (starts_with(rest, "class"))
        {
          return {parse_class(ctx, rest)};
        }
        else if (starts_with(rest, "endclass"))
        {
          return {line_type::class_end, {}};
        }
        else if (starts_with(rest, "member"))
        {
          return parse_class_member(ctx, rest);
        }
        else if (starts_with(rest, "|"))  // trim left
        {
          return parse_text_line(ctx, ctx._line.substr(pos_first_char + 2));
        }
        else
        {
          return parse_text_line(ctx, ctx._line);
        }
        break;
      default:
        return parse_text_line(ctx, ctx._line);
      }
    }
  }